

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  TMS9918<(TI::TMS::Personality)0> *this_00;
  BinaryTapePlayer *this_01;
  MemorySlotChangeHandler *handler;
  PrimarySlot *this_02;
  Observer *pOVar1;
  Source *pSVar2;
  atomic_flag *paVar3;
  unique_ptr<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_> *puVar4;
  __atomic_flag_data_type _Var5;
  int iVar6;
  HalfCycles HVar7;
  MemorySlotHandler *pMVar8;
  size_type sVar9;
  undefined1 auVar10 [16];
  _Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  _Var11;
  _Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false> this_03;
  _Any_data *p_Var12;
  bool bVar13;
  uint uVar14;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  MemorySlot *pMVar15;
  DiskROM *this_04;
  undefined4 *puVar16;
  pointer pNVar17;
  pointer pNVar18;
  pointer pNVar19;
  pointer pNVar20;
  pointer pNVar21;
  undefined7 uVar22;
  size_type sVar23;
  Name name;
  PrimarySlot *this_05;
  pointer pNVar24;
  initializer_list<double> __l;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  string machine_name;
  byte local_17c;
  undefined1 local_178 [8];
  _Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false> _Stack_170;
  undefined1 local_168 [16];
  pointer local_158;
  size_t local_150;
  _Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false> local_140;
  SequencePointAwareDeleter local_138;
  PrimarySlot *local_130;
  _Head_base<1UL,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
  local_128;
  bool local_120;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_118;
  undefined4 local_fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  PrimarySlot *local_f0;
  string *local_e8;
  Speaker<false> *local_e0;
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>,_false,_false>
  *local_d8;
  _Any_data *local_d0;
  long *local_c8 [2];
  long local_b8 [2];
  undefined1 local_a8 [16];
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_98;
  Request local_78;
  vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> local_48;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_0059a130;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00591648;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_00590d68;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_00591610;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_00591690;
  local_158 = (pointer)(local_178 + 8);
  local_178 = (undefined1  [8])0x0;
  _Stack_170._M_head_impl = (TMS9918<(TI::TMS::Personality)0> *)0x0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_158;
  local_168 = auVar10 << 0x40;
  local_150 = 0;
  local_d0 = (_Any_data *)rom_fetcher;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)local_178);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)local_178);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0059a8e8;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0059a9b0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0059a9f8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0059aa10;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0059aa48;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0059aa60;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0059aa90;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_0059aad0;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0059aae8;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_0059ab08;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0059ab20;
  (this->super_MemorySlotChangeHandler)._vptr_MemorySlotChangeHandler = (_func_int **)&DAT_0059ab38;
  CPU::Z80::
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>,_false,_false>::
  Processor(&this->z80_,this);
  (this->vdp_).super_Observer._vptr_Observer =
       (_func_int **)&PTR_set_component_prefers_clocking_00596ee0;
  this_00 = &(this->vdp_).object_;
  local_d8 = &this->z80_;
  TI::TMS::TMS9918<(TI::TMS::Personality)0>::TMS9918(this_00);
  local_138.actor_ = &this->vdp_;
  (this->vdp_).time_since_update_ = (WrappedInt<HalfCycles>)0x0;
  (this->vdp_).time_until_event_ = (WrappedInt<HalfCycles>)0x0;
  (this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = 0;
  (this->vdp_).is_flushed_ = true;
  (this->vdp_).did_flush_ = false;
  (this->vdp_).clocking_preference_ = JustInTime;
  (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
  (this->i8255_).control_ = '\0';
  (this->i8255_).outputs_[0] = '\0';
  (this->i8255_).outputs_[1] = '\0';
  (this->i8255_).outputs_[2] = '\0';
  (this->i8255_).port_handler_ = &this->i8255_port_handler_;
  this_01 = &this->tape_player_;
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(this_01,0x6d3d32);
  this->tape_player_is_sleeping_ = false;
  this->allow_fast_tape_ = false;
  this->use_fast_tape_ = false;
  (this->i8255_port_handler_).machine_ = this;
  (this->i8255_port_handler_).audio_toggle_ = &(this->speaker_).audio_toggle;
  (this->i8255_port_handler_).tape_player_ = this_01;
  (this->i8255_port_handler_).activity_observer_ = (Observer *)0x0;
  Speaker<false>::Speaker(&this->speaker_);
  local_140._M_head_impl = this_00;
  local_e0 = &this->speaker_;
  AYPortHandler::AYPortHandler(&this->ay_port_handler_,this_01);
  handler = &this->super_MemorySlotChangeHandler;
  this->primary_slots_ = '\0';
  this->ram_mapper_[0] = '\0';
  this->ram_mapper_[1] = '\0';
  this->ram_mapper_[2] = '\0';
  this->ram_mapper_[3] = '\0';
  local_f0 = &this->memory_slots_[0].super_PrimarySlot;
  PrimarySlot::PrimarySlot(local_f0,handler);
  this->memory_slots_[0].handler =
       (__uniq_ptr_data<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>,_true,_true>
        )0x0;
  this->memory_slots_[0].cycles_since_update = (WrappedInt<HalfCycles>)0x0;
  PrimarySlot::PrimarySlot(&this->memory_slots_[1].super_PrimarySlot,handler);
  this->memory_slots_[1].handler =
       (__uniq_ptr_data<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>,_true,_true>
        )0x0;
  this->memory_slots_[1].cycles_since_update = (WrappedInt<HalfCycles>)0x0;
  local_130 = &this->memory_slots_[2].super_PrimarySlot;
  PrimarySlot::PrimarySlot(local_130,handler);
  this->memory_slots_[2].handler =
       (__uniq_ptr_data<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>,_true,_true>
        )0x0;
  this->memory_slots_[2].cycles_since_update = (WrappedInt<HalfCycles>)0x0;
  this_02 = &this->memory_slots_[3].super_PrimarySlot;
  PrimarySlot::PrimarySlot(this_02,handler);
  this->selected_key_line_ = 0;
  local_e8 = &this->input_text_;
  local_f8 = &(this->input_text_).field_2;
  this->memory_slots_[3].handler =
       (__uniq_ptr_data<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>,_true,_true>
        )0x0;
  this->memory_slots_[3].cycles_since_update = (WrappedInt<HalfCycles>)0x0;
  this->final_slot_ = (HandledSlot *)0x0;
  this->time_since_ay_update_ = (WrappedInt<HalfCycles>)0x0;
  (this->input_text_)._M_dataplus._M_p = (pointer)local_f8;
  (this->input_text_)._M_string_length = 0;
  (this->input_text_).field_2._M_local_buf[0] = '\0';
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_00599da0;
  this->pc_zero_accesses_ = 0;
  this->performed_unmapped_access_ = false;
  Ricoh::RP5C01::RP5C01::RP5C01(&this->clock_,(HalfCycles)0x369e99);
  this->next_clock_register_ = 0;
  (this->super_TimedMachine).clock_rate_ = 3579545.0;
  this->key_states_[0] = 0xff;
  this->key_states_[1] = 0xff;
  this->key_states_[2] = 0xff;
  this->key_states_[3] = 0xff;
  this->key_states_[4] = 0xff;
  this->key_states_[5] = 0xff;
  this->key_states_[6] = 0xff;
  this->key_states_[7] = 0xff;
  this->key_states_[8] = 0xff;
  this->key_states_[9] = 0xff;
  this->key_states_[10] = 0xff;
  this->key_states_[0xb] = 0xff;
  this->key_states_[0xc] = 0xff;
  this->key_states_[0xd] = 0xff;
  this->key_states_[0xe] = 0xff;
  this->key_states_[0xf] = 0xff;
  GI::AY38910::AY38910SampleSource<false>::set_port_handler
            (&(this->speaker_).ay.super_AY38910SampleSource<false>,
             &(this->ay_port_handler_).super_PortHandler);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>_>,_false>
  ::set_input_rate(&(this->speaker_).speaker.
                    super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>_>,_false>
                   ,1789772.5);
  pOVar1 = &this->super_Observer;
  pSVar2 = &(this->tape_player_).super_TapePlayer.super_Source;
  (this->tape_player_).super_TapePlayer.super_Source.observer_ = pOVar1;
  uVar14 = (**(this->tape_player_).super_TapePlayer.super_Source._vptr_Source)(pSVar2);
  (**pOVar1->_vptr_Observer)(pOVar1,pSVar2,(ulong)uVar14);
  local_78.node._0_8_ =
       (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
       0x3fe0000000000000;
  local_78.node.is_optional = false;
  local_78.node._9_7_ = 0x3fb99999a00000;
  local_78.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fd99999a0000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_78;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_178,__l,(allocator_type *)&local_128);
  this_03._M_head_impl = local_140._M_head_impl;
  Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>::
  set_relative_volumes(&(this->speaker_).mixer,(vector<double,_std::allocator<double>_> *)local_178)
  ;
  if ((SequencePointAwareDeleter)local_178 != (SequencePointAwareDeleter)0x0) {
    operator_delete((void *)local_178,local_168._0_8_ - (long)local_178);
  }
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"MSX","");
  ROM::Request::Request(&local_78,MSXGenericBIOS,false);
  uVar22 = (undefined7)((ulong)handler >> 8);
  if (target->region == USA) {
    LOCK();
    paVar3 = &(this->vdp_).flush_concurrency_check_;
    _Var5 = (paVar3->super___atomic_flag_base)._M_i;
    (paVar3->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var5 != false) goto LAB_0034b051;
    if ((this->vdp_).is_flushed_ == false) {
      (this->vdp_).is_flushed_ = true;
      (this->vdp_).did_flush_ = true;
      HVar7.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(this_03._M_head_impl,HVar7);
    }
    LOCK();
    (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    _Stack_170._M_head_impl = this_03._M_head_impl;
    local_178 = (undefined1  [8])local_138.actor_;
    TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard(this_03._M_head_impl,NTSC);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_178);
    local_fc = (undefined4)CONCAT71(uVar22,0x10);
    local_140._M_head_impl._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
    name = MSXAmericanBIOS;
LAB_0034aa43:
    local_17c = 0;
  }
  else {
    if (target->region != Europe) {
      LOCK();
      paVar3 = &(this->vdp_).flush_concurrency_check_;
      _Var5 = (paVar3->super___atomic_flag_base)._M_i;
      (paVar3->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var5 != false) goto LAB_0034b051;
      if ((this->vdp_).is_flushed_ == false) {
        (this->vdp_).is_flushed_ = true;
        (this->vdp_).did_flush_ = true;
        HVar7.super_WrappedInt<HalfCycles>.length_ =
             (WrappedInt<HalfCycles>)
             (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
        (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
        TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(this_03._M_head_impl,HVar7);
      }
      LOCK();
      (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
      UNLOCK();
      _Stack_170._M_head_impl = this_03._M_head_impl;
      local_178 = (undefined1  [8])local_138.actor_;
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard(this_03._M_head_impl,NTSC);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_178);
      name = MSXJapaneseBIOS;
      local_140._M_head_impl =
           (TMS9918<(TI::TMS::Personality)0> *)((ulong)local_140._M_head_impl & 0xffffffff00000000);
      local_fc = 0;
      goto LAB_0034aa43;
    }
    LOCK();
    paVar3 = &(this->vdp_).flush_concurrency_check_;
    _Var5 = (paVar3->super___atomic_flag_base)._M_i;
    (paVar3->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var5 != false) {
LAB_0034b051:
      __assert_fail("!flush_concurrency_check_.test_and_set()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/MSX/../../ClockReceiver/JustInTime.hpp"
                    ,0x7e,
                    "auto JustInTimeActor<TI::TMS::TMS9918<TI::TMS::TMS9918A>>::operator->() [T = TI::TMS::TMS9918<TI::TMS::TMS9918A>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                   );
    }
    if ((this->vdp_).is_flushed_ == false) {
      (this->vdp_).is_flushed_ = true;
      (this->vdp_).did_flush_ = true;
      HVar7.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(this_03._M_head_impl,HVar7);
    }
    LOCK();
    (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    _Stack_170._M_head_impl = this_03._M_head_impl;
    local_178 = (undefined1  [8])local_138.actor_;
    TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard(this_03._M_head_impl,PAL);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_178);
    local_17c = 0x80;
    local_fc = (undefined4)CONCAT71(uVar22,0x20);
    local_140._M_head_impl._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    name = MSXEuropeanBIOS;
  }
  ROM::Request::Request((Request *)&local_128,name,false);
  ROM::Request::operator||((Request *)local_178,&local_78,(Request *)&local_128);
  local_98.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.node.children.
       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8._8_8_ =
       local_78.node.children.
       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_a8._0_8_ =
       local_78.node.children.
       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var11 = _local_178;
  local_78.node.is_optional = _Stack_170._M_head_impl._0_1_;
  local_78.node.type = local_178._0_4_;
  local_78.node.name = local_178._4_4_;
  local_78.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_158;
  local_78.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
  local_78.node.children.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_168._8_8_;
  local_168 = (undefined1  [16])0x0;
  local_158 = (pointer)0x0;
  _local_178 = _Var11;
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_a8);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_168);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_118);
  local_120 = local_78.node.is_optional;
  local_128._M_head_impl.actor_ =
       (SequencePointAwareDeleter)(SequencePointAwareDeleter)local_78.node._0_8_;
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::vector
            (&local_118,
             (vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &local_78.node.children);
  p_Var12 = local_d0;
  if (target->has_disk_drive == true) {
    ROM::Request::Request((Request *)local_a8,MSXDOS,false);
    ROM::Request::operator&&((Request *)local_178,(Request *)&local_128,(Request *)local_a8);
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_120 = _Stack_170._M_head_impl._0_1_;
    local_128._M_head_impl.actor_ = (SequencePointAwareDeleter)(SequencePointAwareDeleter)local_178;
    local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_158;
    local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
    local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_168._8_8_;
    local_168 = (undefined1  [16])0x0;
    local_158 = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_168);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_98);
  }
  if (target->has_msx_music == true) {
    ROM::Request::Request((Request *)local_a8,MSXMusic,false);
    ROM::Request::operator&&((Request *)local_178,(Request *)&local_128,(Request *)local_a8);
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_120 = _Stack_170._M_head_impl._0_1_;
    local_128._M_head_impl.actor_ = (SequencePointAwareDeleter)(SequencePointAwareDeleter)local_178;
    local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_158;
    local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
    local_118.super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_168._8_8_;
    local_168 = (undefined1  [16])0x0;
    local_158 = (pointer)0x0;
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_48);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)local_168);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_98);
  }
  if (*(long *)(p_Var12 + 1) == 0) {
    std::__throw_bad_function_call();
  }
  (**(code **)((long)p_Var12 + 0x18))
            ((map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_178,p_Var12,(Request *)&local_128);
  bVar13 = ROM::Request::validate((Request *)&local_128,(Map *)local_178);
  if (!bVar13) {
    puVar16 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar16 = 0;
    __cxa_throw(puVar16,&ROMMachine::Error::typeinfo,0);
  }
  pNVar17 = (pointer)local_168._0_8_;
  pNVar24 = (pointer)(local_178 + 8);
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    do {
      pNVar19 = pNVar24;
      pNVar21 = pNVar17;
      iVar6 = *(int *)&(pNVar21->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar24 = pNVar21;
      if (iVar6 < (int)name) {
        pNVar24 = pNVar19;
      }
      pNVar17 = (&(pNVar21->children).
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)[iVar6 < (int)name];
    } while (pNVar17 != (pointer)0x0);
    pNVar17 = (pointer)(local_178 + 8);
    pNVar18 = (pointer)local_168._0_8_;
    if (pNVar24 != pNVar17) {
      if (iVar6 < (int)name) {
        pNVar21 = pNVar19;
      }
      if (*(int *)&(pNVar21->children).
                   super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage <= (int)name) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar24 + 1),0x8000);
        this_05 = local_f0;
        pMVar15 = PrimarySlot::subslot(local_f0,0);
        MemorySlot::set_source
                  (pMVar15,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar24 + 1));
        goto LAB_0034adb8;
      }
    }
    do {
      pNVar19 = pNVar17;
      pNVar21 = pNVar18;
      iVar6 = *(int *)&(pNVar21->children).
                       super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      pNVar17 = pNVar21;
      if (iVar6 < 0x40) {
        pNVar17 = pNVar19;
      }
      pNVar18 = (&(pNVar21->children).
                  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                  _M_impl.super__Vector_impl_data._M_start)[iVar6 < 0x40];
    } while (pNVar18 != (pointer)0x0);
    pNVar18 = (pointer)(local_178 + 8);
    pNVar24 = pNVar18;
    if (pNVar17 != pNVar18) {
      if (iVar6 < 0x40) {
        pNVar21 = pNVar19;
      }
      pNVar24 = pNVar17;
      if (0x40 < *(int *)&(pNVar21->children).
                          super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pNVar24 = pNVar18;
      }
    }
  }
  pNVar24 = pNVar24 + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pNVar24,0x8000);
  this_05 = local_f0;
  *(byte *)((long)&(*(_Base_ptr *)pNVar24)[1]._M_parent + 3) =
       (byte)local_fc | (byte)local_140._M_head_impl | local_17c;
  *(undefined1 *)((long)&(*(_Base_ptr *)pNVar24)[1]._M_parent + 4) = 1;
  pMVar15 = PrimarySlot::subslot(local_f0,0);
  MemorySlot::set_source(pMVar15,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)pNVar24);
LAB_0034adb8:
  pMVar15 = PrimarySlot::subslot(this_05,0);
  MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar15,0,0,0x8000);
  pMVar15 = PrimarySlot::subslot(this_02,0);
  MemorySlot::resize_source(pMVar15,0x10000);
  pMVar15 = PrimarySlot::subslot(this_02,0);
  MemorySlot::map<(MSX::MemorySlot::AccessType)1>(pMVar15,0,0,0x10000);
  pNVar17 = (pointer)(local_178 + 8);
  if (target->has_disk_drive == true) {
    pMVar15 = PrimarySlot::subslot(local_130,0);
    this_04 = (DiskROM *)operator_new(0x4f8);
    DiskROM::DiskROM(this_04,pMVar15);
    puVar4 = &this->memory_slots_[2].handler;
    pMVar8 = (puVar4->_M_t).
             super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
             .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl;
    (puVar4->_M_t).
    super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>._M_t
    .super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>.
    super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
         (MemorySlotHandler *)this_04;
    if (pMVar8 != (MemorySlotHandler *)0x0) {
      (*pMVar8->_vptr_MemorySlotHandler[1])();
    }
    pNVar21 = pNVar17;
    pNVar24 = (pointer)local_168._0_8_;
    pNVar19 = pNVar17;
    if ((pointer)local_168._0_8_ != (pointer)0x0) {
      do {
        pNVar18 = pNVar24;
        pNVar20 = pNVar21;
        iVar6 = *(int *)&(pNVar18->children).
                         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pNVar21 = pNVar18;
        if (iVar6 < 0x44) {
          pNVar21 = pNVar20;
        }
        pNVar24 = (&(pNVar18->children).
                    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start)[iVar6 < 0x44];
      } while (pNVar24 != (pointer)0x0);
      if (pNVar21 != pNVar17) {
        if (iVar6 < 0x44) {
          pNVar18 = pNVar20;
        }
        pNVar19 = pNVar21;
        if (0x44 < *(int *)&(pNVar18->children).
                            super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pNVar19 = pNVar17;
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar19 + 1),0x4000);
    pMVar15 = PrimarySlot::subslot(local_130,0);
    MemorySlot::set_source
              (pMVar15,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar19 + 1));
    pMVar15 = PrimarySlot::subslot(local_130,0);
    MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar15,0,0x4000,0x2000);
    pMVar15 = PrimarySlot::subslot(local_130,0);
    MemorySlot::map_handler(pMVar15,0x6000,0x2000);
  }
  if (target->has_msx_music == true) {
    pNVar21 = pNVar17;
    pNVar24 = (pointer)local_168._0_8_;
    if ((pointer)local_168._0_8_ != (pointer)0x0) {
      do {
        pNVar19 = pNVar24;
        pNVar18 = pNVar21;
        iVar6 = *(int *)&(pNVar19->children).
                         super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pNVar21 = pNVar19;
        if (iVar6 < 0x47) {
          pNVar21 = pNVar18;
        }
        pNVar24 = (&(pNVar19->children).
                    super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                    _M_impl.super__Vector_impl_data._M_start)[iVar6 < 0x47];
      } while (pNVar24 != (pointer)0x0);
      if (pNVar21 != pNVar17) {
        if (iVar6 < 0x47) {
          pNVar19 = pNVar18;
        }
        if (*(int *)&(pNVar19->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage < 0x48) {
          pNVar17 = pNVar21;
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar17 + 1),0x10000);
    pMVar15 = PrimarySlot::subslot(this_02,2);
    MemorySlot::set_source
              (pMVar15,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pNVar17 + 1));
    pMVar15 = PrimarySlot::subslot(this_02,2);
    MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar15,0,0,0x10000);
  }
  insert_media(this,&(target->super_Target).media);
  sVar9 = (target->loading_command)._M_string_length;
  if (sVar9 != 0) {
    sVar23 = 0;
    do {
      std::__cxx11::string::push_back((char)local_e8);
      sVar23 = sVar23 + 1;
    } while (sVar9 != sVar23);
  }
  this->primary_slots_ = '\0';
  update_paging(this);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)local_178);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector(&local_118);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &local_78.node.children);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0],local_b8[0] + 1);
  }
  return;
}

Assistant:

ConcreteMachine(const Target &target, const ROMMachine::ROMFetcher &rom_fetcher):
			z80_(*this),
			i8255_(i8255_port_handler_),
			tape_player_(3579545 * 2),
			i8255_port_handler_(*this, speaker_.audio_toggle, tape_player_),
			ay_port_handler_(tape_player_),
			memory_slots_{{*this}, {*this}, {*this}, {*this}},
			clock_(ClockRate) {
			set_clock_rate(ClockRate);
			clear_all_keys();

			speaker_.ay.set_port_handler(&ay_port_handler_);
			speaker_.speaker.set_input_rate(3579545.0f / 2.0f);
			tape_player_.set_clocking_hint_observer(this);

			// Set the AY to 50% of available volume, the toggle to 10% and leave 40% for an SCC.
			// If there is an OPLL, give it equal volume to the AY and expect some clipping.
			if constexpr (has_opll) {
				speaker_.mixer.set_relative_volumes({0.5f, 0.1f, 0.4f, 0.5f});
			} else {
				speaker_.mixer.set_relative_volumes({0.5f, 0.1f, 0.4f});
			}

			// Install the proper TV standard and select an ideal BIOS name.
			const std::string machine_name = "MSX";
			constexpr ROM::Name bios_name = model == Target::Model::MSX1 ? ROM::Name::MSXGenericBIOS : ROM::Name::MSX2GenericBIOS;

			ROM::Request bios_request = ROM::Request(bios_name);
			if constexpr (model == Target::Model::MSX2) {
				bios_request = bios_request && ROM::Request(ROM::Name::MSX2Extension);
			}

			bool is_ntsc = true;
			uint8_t character_generator = 1;	/* 0 = Japan, 1 = USA, etc, 2 = USSR */
			uint8_t date_format = 1;			/* 0 = Y/M/D, 1 = M/D/Y, 2 = D/M/Y */
			uint8_t keyboard = 1;				/* 0 = Japan, 1 = USA, 2 = France, 3 = UK, 4 = Germany, 5 = USSR, 6 = Spain */
			[[maybe_unused]] ROM::Name regional_bios_name;

			switch(target.region) {
				default:
				case Target::Region::Japan:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXJapaneseBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::NTSC);

					is_ntsc = true;
					character_generator = 0;
					date_format = 0;
				break;
				case Target::Region::USA:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXAmericanBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::NTSC);

					is_ntsc = true;
					character_generator = 1;
					date_format = 1;
				break;
				case Target::Region::Europe:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXEuropeanBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::PAL);

					is_ntsc = false;
					character_generator = 1;
					date_format = 2;
				break;
			}
			if constexpr (model == Target::Model::MSX1) {
				bios_request = bios_request || ROM::Request(regional_bios_name);
			}

			// Fetch the necessary ROMs; try the region-specific ROM first,
			// but failing that fall back on patching the main one.
			ROM::Request request = bios_request;
			if(target.has_disk_drive) {
				request = request && ROM::Request(ROM::Name::MSXDOS);
			}
			if(target.has_msx_music) {
				request = request && ROM::Request(ROM::Name::MSXMusic);
			}

			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// Figure out which BIOS to use, either a specific one or the generic
			// one appropriately patched.
			bool has_bios = false;
			if constexpr (model == Target::Model::MSX1) {
				const auto regional_bios = roms.find(regional_bios_name);
				if(regional_bios != roms.end()) {
					regional_bios->second.resize(32768);
					bios_slot().set_source(regional_bios->second);
					has_bios = true;
				}
			}
			if(!has_bios) {
				std::vector<uint8_t> &bios = roms.find(bios_name)->second;

				bios.resize(32768);

				// Modify the generic ROM to reflect the selected region, date format, etc.
				bios[0x2b] = uint8_t(
					(is_ntsc ? 0x00 : 0x80) |
					(date_format << 4) |
					character_generator
				);
				bios[0x2c] = keyboard;

				bios_slot().set_source(bios);
			}

			bios_slot().map(0, 0, 32768);

			ram_slot().resize_source(RAMSize);
			ram_slot().template map<MemorySlot::AccessType::ReadWrite>(0, 0, 65536);

			if constexpr (model == Target::Model::MSX2) {
				memory_slots_[3].supports_secondary_paging = true;

				const auto extension = roms.find(ROM::Name::MSX2Extension);
				extension->second.resize(32768);
				extension_rom_slot().set_source(extension->second);
				extension_rom_slot().map(0, 0, 32768);
			}

			// Add a disk cartridge if any disks were supplied.
			if(target.has_disk_drive) {
				disk_primary().handler = std::make_unique<DiskROM>(disk_slot());

				std::vector<uint8_t> &dos = roms.find(ROM::Name::MSXDOS)->second;
				dos.resize(16384);
				disk_slot().set_source(dos);

				disk_slot().map(0, 0x4000, 0x2000);
				disk_slot().map_handler(0x6000, 0x2000);
			}

			// Grab the MSX-MUSIC ROM if applicable.
			if(target.has_msx_music) {
				std::vector<uint8_t> &msx_music = roms.find(ROM::Name::MSXMusic)->second;
				msx_music.resize(65536);
				msx_music_slot().set_source(msx_music);
				msx_music_slot().map(0, 0, 0x10000);
			}

			// Insert the media.
			insert_media(target.media);

			// Type whatever has been requested.
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			// Establish default paging.
			page_primary(0);
		}